

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>::
UntypedPerformAction
          (FunctionMockerBase<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *this,
          void *untyped_action,void *untyped_args)

{
  ActionResultHolder<TestCountExpr> *pAVar1;
  Action<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> action;
  linked_ptr<testing::ActionInterface<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>_>
  local_20;
  
  linked_ptr<testing::ActionInterface<TestCountExpr(TestExprBuilder<3,BasicTestExpr<2>>)>>::
  copy<testing::ActionInterface<TestCountExpr(TestExprBuilder<3,BasicTestExpr<2>>)>>
            ((linked_ptr<testing::ActionInterface<TestCountExpr(TestExprBuilder<3,BasicTestExpr<2>>)>>
              *)&local_20,
             (linked_ptr<testing::ActionInterface<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>_>
              *)untyped_action);
  pAVar1 = ActionResultHolder<TestCountExpr>::
           PerformAction<TestCountExpr(TestExprBuilder<3,BasicTestExpr<2>>)>
                     ((Action<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *)&local_20,
                      (ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>_>::
  ~linked_ptr(&local_20);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }